

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O0

void pixels::compareExact(float af,float bf,int x,int y,char *taga,char *tagb,char *chan)

{
  ostream *poVar1;
  char *in_RCX;
  char *in_RDX;
  int in_ESI;
  int in_EDI;
  char *in_R8;
  float in_XMM0_Da;
  float in_XMM1_Da;
  anon_union_4_2_f9ecb1fe b;
  anon_union_4_2_f9ecb1fe a;
  char *in_stack_ffffffffffffffc8;
  float line;
  
  line = in_XMM0_Da;
  if (in_XMM0_Da != in_XMM1_Da) {
    poVar1 = std::operator<<((ostream *)&std::cout,in_R8);
    poVar1 = std::operator<<(poVar1," float at ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_EDI);
    poVar1 = std::operator<<(poVar1,", ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_ESI);
    poVar1 = std::operator<<(poVar1," not equal: ");
    poVar1 = std::operator<<(poVar1,in_RDX);
    poVar1 = std::operator<<(poVar1," 0x");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)line);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM0_Da);
    poVar1 = std::operator<<(poVar1,") vs ");
    poVar1 = std::operator<<(poVar1,in_RCX);
    poVar1 = std::operator<<(poVar1," ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::hex);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)in_XMM1_Da);
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::dec);
    poVar1 = std::operator<<(poVar1," (");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM1_Da);
    poVar1 = std::operator<<(poVar1,")");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  if (line != in_XMM1_Da) {
    core_test_fail(in_RCX,in_R8,(uint)line,in_stack_ffffffffffffffc8);
  }
  return;
}

Assistant:

static inline void compareExact (
        float       af,
        float       bf,
        int         x,
        int         y,
        const char* taga,
        const char* tagb,
        const char* chan)
    {
        union
        {
            uint32_t iv;
            float    fv;
        } a, b;
        a.fv = af;
        b.fv = bf;
        if (a.iv != b.iv)
        {
            std::cout << chan << " float at " << x << ", " << y
                      << " not equal: " << taga << " 0x" << std::hex << a.iv
                      << std::dec << " (" << af << ") vs " << tagb << " "
                      << std::hex << b.iv << std::dec << " (" << bf << ")"
                      << std::endl;
        }
        EXRCORE_TEST (a.iv == b.iv);
    }